

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

ScalarFunction * duckdb::CombineFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff04;
  FunctionNullHandling in_stack_ffffffffffffff10;
  allocator_type local_e9;
  code *bind_lambda;
  LogicalType local_c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  string local_90;
  LogicalType local_70;
  LogicalType local_58 [2];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"combine","");
  LogicalType::LogicalType(local_58,AGGREGATE_STATE);
  LogicalType::LogicalType(local_58 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a8,__l,&local_e9);
  LogicalType::LogicalType(&local_c0,AGGREGATE_STATE);
  bind_lambda = AggregateStateCombine;
  LogicalType::LogicalType(&local_70,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_70;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffefc;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff04;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_90,(vector<duckdb::LogicalType,_true> *)&local_a8,&local_c0,
             (scalar_function_t *)&stack0xffffffffffffff18,BindAggregateState,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,InitCombineState,
             varargs,CONSISTENT,in_stack_ffffffffffffff10,bind_lambda);
  LogicalType::~LogicalType(&local_70);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff18,(_Any_data *)&stack0xffffffffffffff18,
               __destroy_functor);
  LogicalType::~LogicalType(&local_c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  in_RDI->serialize = ExportStateScalarSerialize;
  in_RDI->deserialize = ExportStateScalarDeserialize;
  return in_RDI;
}

Assistant:

ScalarFunction CombineFun::GetFunction() {
	auto result =
	    ScalarFunction("combine", {LogicalTypeId::AGGREGATE_STATE, LogicalTypeId::ANY}, LogicalTypeId::AGGREGATE_STATE,
	                   AggregateStateCombine, BindAggregateState, nullptr, nullptr, InitCombineState);
	result.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	result.serialize = ExportStateScalarSerialize;
	result.deserialize = ExportStateScalarDeserialize;
	return result;
}